

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function.h
# Opt level: O0

void __thiscall
xLearn::Score::Initialize
          (Score *this,real_t learning_rate,real_t regu_lambda,real_t alpha,real_t beta,
          real_t lambda_1,real_t lambda_2,string *opt_type)

{
  string *in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM5_Da;
  
  *(undefined4 *)(in_RDI + 8) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0xc) = in_XMM1_Da;
  *(undefined4 *)(in_RDI + 0x10) = in_XMM2_Da;
  *(undefined4 *)(in_RDI + 0x14) = in_XMM3_Da;
  *(undefined4 *)(in_RDI + 0x18) = in_XMM4_Da;
  *(undefined4 *)(in_RDI + 0x1c) = in_XMM5_Da;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),in_RSI);
  return;
}

Assistant:

virtual void Initialize(real_t learning_rate,
                          real_t regu_lambda,
                          real_t alpha,
                          real_t beta,
                          real_t lambda_1,
                          real_t lambda_2,
                          std::string& opt_type) {
    learning_rate_ = learning_rate;
    regu_lambda_ = regu_lambda;
    alpha_ = alpha;
    beta_ = beta;
    lambda_1_ = lambda_1;
    lambda_2_ = lambda_2;
    opt_type_ = opt_type;
  }